

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cxx::StringFieldGenerator::GenerateSerializeWithCachedSizesToArray
          (StringFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  Type TVar2;
  FileDescriptor *file;
  Printer *printer_local;
  StringFieldGenerator *this_local;
  
  file = FieldDescriptor::file(this->descriptor_);
  bVar1 = HasUtf8Verification(file);
  if ((bVar1) && (TVar2 = FieldDescriptor::type(this->descriptor_), TVar2 == TYPE_STRING)) {
    io::Printer::Print(printer,&this->variables_,
                       "::google::protobuf::internal::WireFormat::VerifyUTF8String(\n  this->$name$().data(), this->$name$().length(),\n  ::google::protobuf::internal::WireFormat::SERIALIZE);\n"
                      );
  }
  io::Printer::Print(printer,&this->variables_,
                     "target =\n  ::google::protobuf::internal::WireFormatLite::Write$declared_type$ToArray(\n    $number$, this->$name$(), target);\n"
                    );
  return;
}

Assistant:

void StringFieldGenerator::
GenerateSerializeWithCachedSizesToArray(io::Printer* printer) const {
  if (HasUtf8Verification(descriptor_->file()) &&
      descriptor_->type() == FieldDescriptor::TYPE_STRING) {
    printer->Print(variables_,
      "::google::protobuf::internal::WireFormat::VerifyUTF8String(\n"
      "  this->$name$().data(), this->$name$().length(),\n"
      "  ::google::protobuf::internal::WireFormat::SERIALIZE);\n");
  }
  printer->Print(variables_,
    "target =\n"
    "  ::google::protobuf::internal::WireFormatLite::Write$declared_type$ToArray(\n"
    "    $number$, this->$name$(), target);\n");
}